

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  ulong uVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  uint extraout_EAX;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  uchar *data;
  size_t sVar8;
  ulong __size;
  
  if ((info->palettesize & 0x3fffffffffffffff) == 0) {
    data = (uchar *)0x0;
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    sVar8 = 0;
    uVar6 = 0;
    data = (uchar *)0x0;
    do {
      if ((~(uint)lVar7 & 3) != 0) {
        uVar2 = info->palette[lVar7];
        uVar1 = uVar6 + 1;
        if (sVar8 < uVar1) {
          __size = uVar1 * 3 >> 1;
          if (sVar8 * 2 < uVar1) {
            __size = uVar1;
          }
          puVar5 = (uchar *)realloc(data,__size);
          if (puVar5 == (uchar *)0x0) {
            bVar3 = true;
          }
          else {
            bVar3 = false;
            data = puVar5;
            sVar8 = __size;
          }
        }
        else {
          bVar3 = false;
        }
        if (!bVar3) {
          data[uVar6] = uVar2;
          uVar6 = uVar1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != info->palettesize << 2);
  }
  uVar4 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar6,"PLTE",data);
  if (uVar4 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info)
{
	unsigned error = 0;
	size_t i;
	ucvector PLTE;
	ucvector_init(&PLTE);
	for (i = 0; i != info->palettesize * 4; ++i)
	{
		/*add all channels except alpha channel*/
		if (i % 4 != 3) ucvector_push_back(&PLTE, info->palette[i]);
	}
	error = addChunk(out, "PLTE", PLTE.data, PLTE.size);
	ucvector_cleanup(&PLTE);

	return error;
}